

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlSetTexture(uint id)

{
  int *piVar1;
  uint uVar2;
  DrawCall *pDVar3;
  _Bool _Var4;
  long lVar5;
  uint uVar6;
  
  if (id == 0) {
    if ((RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].elementsCount * 4 <=
        (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter) {
      rlDrawRenderBatch(RLGL.currentBatch);
      return;
    }
  }
  else {
    pDVar3 = (RLGL.currentBatch)->draws;
    lVar5 = (long)(RLGL.currentBatch)->drawsCounter;
    if (pDVar3[lVar5 + -1].textureId != id) {
      uVar2 = pDVar3[lVar5 + -1].vertexCount;
      if (0 < (int)uVar2) {
        if (pDVar3[lVar5 + -1].mode == 4) {
          uVar6 = 1;
          if (3 < (int)uVar2) {
            uVar6 = 4 - (uVar2 & 3);
          }
        }
        else {
          uVar6 = 0;
          if ((pDVar3[lVar5 + -1].mode == 1) && (uVar6 = uVar2 & 3, (int)uVar2 < 4)) {
            uVar6 = uVar2;
          }
        }
        pDVar3[lVar5 + -1].vertexAlignment = uVar6;
        _Var4 = rlCheckRenderBatchLimit
                          ((RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1].
                           vertexAlignment);
        if (!_Var4) {
          piVar1 = &(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter;
          *piVar1 = *piVar1 + (RLGL.currentBatch)->draws
                              [(long)(RLGL.currentBatch)->drawsCounter + -1].vertexAlignment;
          piVar1 = &(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].cCounter;
          *piVar1 = *piVar1 + (RLGL.currentBatch)->draws
                              [(long)(RLGL.currentBatch)->drawsCounter + -1].vertexAlignment;
          piVar1 = &(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].tcCounter;
          *piVar1 = *piVar1 + (RLGL.currentBatch)->draws
                              [(long)(RLGL.currentBatch)->drawsCounter + -1].vertexAlignment;
          (RLGL.currentBatch)->drawsCounter = (RLGL.currentBatch)->drawsCounter + 1;
        }
      }
      if (0xff < (RLGL.currentBatch)->drawsCounter) {
        rlDrawRenderBatch(RLGL.currentBatch);
      }
      (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1].textureId = id;
      (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1].vertexCount = 0;
    }
  }
  return;
}

Assistant:

void rlSetTexture(unsigned int id)
{
    if (id == 0)
    {
#if defined(GRAPHICS_API_OPENGL_11)
        rlDisableTexture();
#else
        // NOTE: If quads batch limit is reached, we force a draw call and next batch starts
        if (RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter >=
            RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].elementsCount*4)
        {
            rlDrawRenderBatch(RLGL.currentBatch);
        }
#endif
    }
    else
    {
#if defined(GRAPHICS_API_OPENGL_11)
        rlEnableTexture(id);
#else
        if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].textureId != id)
        {
            if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount > 0)
            {
                // Make sure current RLGL.currentBatch->draws[i].vertexCount is aligned a multiple of 4,
                // that way, following QUADS drawing will keep aligned with index processing
                // It implies adding some extra alignment vertex at the end of the draw,
                // those vertex are not processed but they are considered as an additional offset
                // for the next set of vertex to be drawn
                if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].mode == RL_LINES) RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount < 4)? RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount : RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount%4);
                else if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].mode == RL_TRIANGLES) RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount < 4)? 1 : (4 - (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount%4)));
                else RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment = 0;

                if (!rlCheckRenderBatchLimit(RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment))
                {
                    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment;
                    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].cCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment;
                    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].tcCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment;

                    RLGL.currentBatch->drawsCounter++;
                }
            }

            if (RLGL.currentBatch->drawsCounter >= DEFAULT_BATCH_DRAWCALLS) rlDrawRenderBatch(RLGL.currentBatch);

            RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].textureId = id;
            RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount = 0;
        }
#endif
    }
}